

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.cpp
# Opt level: O2

double * __thiscall L15_4::Sales::operator[](Sales *this,int i)

{
  BadIndex *this_00;
  allocator local_41;
  string local_40;
  
  if ((uint)i < 0xd) {
    return this->_gross + (uint)i;
  }
  this_00 = (BadIndex *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string((string *)&local_40,"Index Error in Sales Object\n",&local_41);
  BadIndex::BadIndex(this_00,i,&local_40);
  __cxa_throw(this_00,&BadIndex::typeinfo,std::logic_error::~logic_error);
}

Assistant:

double & Sales::operator[](int i) {
        if (i < 0 || i > MONTHS) {
            throw BadIndex(i);
        }
        return _gross[i];
    }